

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<toml::local_date,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_local_date<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::local_date,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  const_iterator rollback;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  value_type *pvVar9;
  value_type *pvVar10;
  internal_error *piVar11;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *plVar12;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  d;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  m;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  y;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  string local_328;
  int local_2fc;
  string local_2f8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [24];
  undefined8 local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  string local_278;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  undefined8 local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e8 [3];
  int local_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [64];
  string local_158;
  string local_138;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_c8 [8];
  undefined1 local_c0 [72];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_78;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_78,
             (sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>
              *)this,loc);
  if (local_78.is_ok_ == true) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar9 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_138,(detail *)(pvVar9->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar9->last_)._M_current,in_RCX);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&local_118,&local_158,&local_138);
    plVar12 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      plVar12 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      plVar12 = extraout_RDX_01;
    }
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_c8,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>> *)
               &local_118,plVar12);
    if (((local_c8[0] != true) ||
        (plVar12 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(((local_118.source_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_M_dataplus)._M_p +
                      (local_118.source_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_M_string_length),
        (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_118.iter_._M_current == plVar12)) || (*local_118.iter_._M_current != '-')) {
      piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
      local_2d0._0_8_ = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d0,"[error]: toml::parse_inner_local_date: invalid year format",""
                );
      local_2f8._M_dataplus._M_p = (pointer)&local_118;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a8,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_2f8,(char (*) [14])"should be `-`");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1a8;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_250,__l_00,(allocator_type *)&local_278);
      local_328._M_dataplus._M_p = (pointer)0x0;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity = 0;
      format_underline((string *)local_200,(string *)local_2d0,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_250,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_328);
      internal_error::internal_error(piVar11,(string *)local_200);
      __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_118.iter_._M_current = local_118.iter_._M_current + 1;
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_1a8,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)
               &local_118,plVar12);
    if (((local_1a8[0] != true) ||
        (plVar12 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(((local_118.source_.
                         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_M_dataplus)._M_p +
                      (local_118.source_.
                       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_M_string_length),
        (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_118.iter_._M_current == plVar12)) || (*local_118.iter_._M_current != '-')) {
      piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
      local_250._0_8_ = &local_240;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,"[error]: toml::parse_local_date: invalid month format","");
      local_278._M_dataplus._M_p = (pointer)&local_118;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_200,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_278,(char (*) [14])"should be `-`");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_200;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_328,__l_01,(allocator_type *)&local_280);
      local_2f8._M_dataplus._M_p = (pointer)0x0;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      format_underline((string *)local_2d0,(string *)local_250,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_328,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2f8);
      internal_error::internal_error(piVar11,(string *)local_2d0);
      __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_118.iter_._M_current = local_118.iter_._M_current + 1;
    last._M_current =
         (char *)local_118.source_.
                 super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_200,
               (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)
               &local_118,plVar12);
    if (local_200[0] == false) {
      piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_328,"[error]: toml::parse_local_date: invalid day format","");
      local_280 = &local_118;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2d0,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_280,(char (*) [5])0x14877b);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_2d0;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_2f8,__l_02,(allocator_type *)&local_2fc);
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      local_278.field_2._M_allocated_capacity = 0;
      format_underline((string *)local_250,&local_328,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_2f8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_278);
      internal_error::internal_error(piVar11,(string *)local_250);
      __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar10 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_c8);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&local_328,(detail *)(pvVar10->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar10->last_)._M_current,last);
    local_280 = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((ulong)local_280._4_4_ << 0x20);
    uVar6 = from_string<int,int>(&local_328,(int *)&local_280);
    pvVar10 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_1a8);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&local_2f8,(detail *)(pvVar10->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar10->last_)._M_current,last);
    local_2fc = 0;
    iVar7 = from_string<int,int>(&local_2f8,&local_2fc);
    pvVar10 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                        *)local_200);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&local_278,(detail *)(pvVar10->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar10->last_)._M_current,last);
    local_1ac = 0;
    iVar8 = from_string<int,int>(&local_278,&local_1ac);
    pvVar9 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&local_78);
    local_250._0_4_ = uVar6 & 0xffff | iVar7 * 0x10000 + 0xff0000U & 0xff0000 | iVar8 << 0x18;
    region<std::vector<char,_std::allocator<char>_>_>::region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_250 + 8),pvVar9);
    uVar5 = local_228;
    uVar4 = local_240._8_8_;
    uVar3 = local_240._M_allocated_capacity;
    local_2c0._16_8_ = &local_2a0;
    local_2d0._0_4_ = local_250._0_4_;
    local_2d0._8_8_ = &PTR__region_0015dac0;
    local_240._M_allocated_capacity = 0;
    local_240._8_8_ = 0;
    if (local_230 == &local_220) {
      local_2a0._8_8_ = local_220._8_8_;
      local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._16_8_;
    }
    local_2a0._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
    local_2a0._M_local_buf[0] = local_220._M_local_buf[0];
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_290 = local_210;
    uStack_288 = uStack_208;
    __return_storage_ptr__->is_ok_ = true;
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_250._0_4_;
    (__return_storage_ptr__->field_1).fail.value._M_string_length = (size_type)&PTR__region_0015dac0
    ;
    local_2c0._8_8_ = 0;
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = uVar3;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = uVar4;
    local_2c0._0_8_ = 0;
    psVar2 = (size_type *)((long)&__return_storage_ptr__->field_1 + 0x30);
    *(size_type **)((long)&__return_storage_ptr__->field_1 + 0x20) = psVar2;
    if (local_230 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._16_8_) {
      *psVar2 = local_2a0._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_2a0._8_8_;
    }
    else {
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&__return_storage_ptr__->field_1 + 0x20) = local_230;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_2a0._M_allocated_capacity;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = uVar5;
    local_2a8 = 0;
    local_2a0._M_allocated_capacity = (ulong)(uint7)local_220._M_allocated_capacity._1_7_ << 8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) = local_210;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = uStack_208;
    local_230 = &local_220;
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_2d0 + 8));
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_250 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (local_200[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_200 + 8));
    }
    if (local_1a8[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_1a8 + 8));
    }
    if (local_c8[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_c0);
    }
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&local_118);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    local_2d0._0_8_ = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d0,"[error]: toml::parse_local_date: ","");
    local_c8 = (undefined1  [8])this;
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"the next token is not a local_date","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_c8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_250,__l,(allocator_type *)&local_328);
    local_118.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_118.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_118.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)local_200,(string *)local_2d0,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_250,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_118);
    uVar3 = local_200._8_8_;
    local_1a8._0_8_ = local_198;
    if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
      local_198._8_8_ = aaStack_1e8[0]._0_8_;
      local_200._0_8_ = local_1a8._0_8_;
    }
    local_198._1_7_ = local_200._17_7_;
    local_198[0] = local_200[0x10];
    local_200._8_8_ = (_func_int **)0x0;
    local_200[0x10] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_200._0_8_ == local_1a8._0_8_) {
      paVar1->_M_allocated_capacity = local_198._0_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_200._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_198._0_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = uVar3;
    local_1a8._8_8_ = (_func_int **)0x0;
    local_198._0_8_ = (ulong)(uint7)local_200._17_7_ << 8;
    local_200._0_8_ = local_200 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_250);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
    }
    if ((undefined1 *)local_2d0._0_8_ != local_2c0) {
      operator_delete((void *)local_2d0._0_8_,local_2c0._0_8_ + 1);
    }
  }
  if (local_78.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<local_date, region<Container>>, std::string>
parse_local_date(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_local_date::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());

        const auto y = lex_date_fullyear::invoke(inner_loc);
        if(!y || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_inner_local_date: invalid year format",
                {{std::addressof(inner_loc), "should be `-`"}}));
        }
        inner_loc.advance();
        const auto m = lex_date_month::invoke(inner_loc);
        if(!m || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_date: invalid month format",
                {{std::addressof(inner_loc), "should be `-`"}}));
        }
        inner_loc.advance();
        const auto d = lex_date_mday::invoke(inner_loc);
        if(!d)
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_local_date: invalid day format",
                {{std::addressof(inner_loc), "here"}}));
        }
        return ok(std::make_pair(local_date(
            static_cast<std::int16_t>(from_string<int>(y.unwrap().str(), 0)),
            static_cast<month_t>(
                static_cast<std::int8_t>(from_string<int>(m.unwrap().str(), 0)-1)),
            static_cast<std::int8_t>(from_string<int>(d.unwrap().str(), 0))),
            token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("[error]: toml::parse_local_date: ",
            {{std::addressof(loc), "the next token is not a local_date"}}));
    }
}